

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O1

void __thiscall
flatbuffers::go::GoGenerator::BeginFile
          (GoGenerator *this,string *name_space_name,bool needs_imports,bool is_enum,
          string *code_ptr)

{
  pointer pcVar1;
  Parser *pPVar2;
  IdlNamer *pIVar3;
  long *plVar4;
  undefined8 *puVar5;
  _Base_ptr p_Var6;
  undefined7 in_register_00000009;
  long *plVar7;
  size_type *psVar8;
  ulong *puVar9;
  ulong uVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  _Rb_tree_header *p_Var13;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  IdlNamer *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  GoGenerator *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  size_type local_40 [2];
  
  local_a0 = (IdlNamer *)CONCAT44(local_a0._4_4_,(int)CONCAT71(in_register_00000009,is_enum));
  pcVar1 = (code_ptr->_M_dataplus)._M_p;
  local_100 = &local_f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar1,pcVar1 + code_ptr->_M_string_length);
  std::__cxx11::string::append((char *)&local_100);
  std::__cxx11::string::operator=((string *)code_ptr,(string *)&local_100);
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  std::operator+(&local_e0,"package ",name_space_name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_e0);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_f0 = *plVar7;
    lStack_e8 = plVar4[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *plVar7;
    local_100 = (long *)*plVar4;
  }
  local_f8 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_100);
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (needs_imports) {
    std::__cxx11::string::append((char *)code_ptr);
    if (this->needs_bytes_import_ == true) {
      std::__cxx11::string::append((char *)code_ptr);
    }
    pPVar2 = (this->super_BaseGenerator).parser_;
    if ((pPVar2->opts).go_import._M_string_length == 0) {
      std::__cxx11::string::append((char *)code_ptr);
    }
    else {
      std::operator+(&local_e0,"\tflatbuffers \"",&(pPVar2->opts).go_import);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_e0);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_f0 = *plVar7;
        lStack_e8 = plVar4[3];
        local_100 = &local_f0;
      }
      else {
        local_f0 = *plVar7;
        local_100 = (long *)*plVar4;
      }
      local_f8 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_100);
      if (local_100 != &local_f0) {
        operator_delete(local_100,local_f0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    }
    pIVar3 = local_a0;
    if (this->needs_math_import_ == true) {
      std::__cxx11::string::append((char *)code_ptr);
    }
    if ((char)pIVar3 != '\0') {
      std::__cxx11::string::append((char *)code_ptr);
    }
    if ((this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
    {
      std::__cxx11::string::append((char *)code_ptr);
      p_Var6 = (this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left;
      p_Var13 = &(this->tracked_imported_namespaces_)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var6 != p_Var13) {
        local_a0 = &this->namer_;
        local_58 = this;
        do {
          plVar4 = (long *)(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                             (p_Var6 + 1))[5]._M_string_length;
          if (*plVar4 == plVar4[1]) {
            std::operator+(&local_98,"\t",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (p_Var6 + 1));
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
            local_c0 = &local_b0;
            puVar9 = (ulong *)(plVar4 + 2);
            if ((ulong *)*plVar4 == puVar9) {
              local_b0 = *puVar9;
              lStack_a8 = plVar4[3];
            }
            else {
              local_b0 = *puVar9;
              local_c0 = (ulong *)*plVar4;
            }
            local_b8 = plVar4[1];
            *plVar4 = (long)puVar9;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_c0,**(ulong **)(p_Var6 + 1));
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            psVar8 = puVar5 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_e0.field_2._M_allocated_capacity = *psVar8;
              local_e0.field_2._8_8_ = puVar5[3];
            }
            else {
              local_e0.field_2._M_allocated_capacity = *psVar8;
              local_e0._M_dataplus._M_p = (pointer)*puVar5;
            }
            local_e0._M_string_length = puVar5[1];
            *puVar5 = psVar8;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_e0);
            plVar7 = plVar4 + 2;
            if ((long *)*plVar4 == plVar7) {
              local_f0 = *plVar7;
              lStack_e8 = plVar4[3];
              local_100 = &local_f0;
            }
            else {
              local_f0 = *plVar7;
              local_100 = (long *)*plVar4;
            }
            local_f8 = plVar4[1];
            *plVar4 = (long)plVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_100);
            if (local_100 != &local_f0) {
              operator_delete(local_100,local_f0 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            if (local_c0 != &local_b0) {
              operator_delete(local_c0,local_b0 + 1);
            }
            uVar11 = local_98.field_2._M_allocated_capacity;
            _Var12._M_p = local_98._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) goto LAB_0020378f;
          }
          else {
            (*(local_a0->super_Namer)._vptr_Namer[10])(local_50,local_a0,plVar4);
            plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x374c6a);
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            psVar8 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_98.field_2._M_allocated_capacity = *psVar8;
              local_98.field_2._8_8_ = plVar4[3];
            }
            else {
              local_98.field_2._M_allocated_capacity = *psVar8;
              local_98._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_98._M_string_length = plVar4[1];
            *plVar4 = (long)psVar8;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
            puVar9 = (ulong *)(plVar4 + 2);
            if ((ulong *)*plVar4 == puVar9) {
              local_b0 = *puVar9;
              lStack_a8 = plVar4[3];
              local_c0 = &local_b0;
            }
            else {
              local_b0 = *puVar9;
              local_c0 = (ulong *)*plVar4;
            }
            local_b8 = plVar4[1];
            *plVar4 = (long)puVar9;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            NamespaceImportPath_abi_cxx11_
                      (&local_78,local_58,*(Namespace **)(*(long *)(p_Var6 + 1) + 0xa8));
            uVar10 = 0xf;
            if (local_c0 != &local_b0) {
              uVar10 = local_b0;
            }
            if (uVar10 < local_78._M_string_length + local_b8) {
              uVar11 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                uVar11 = local_78.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar11 < local_78._M_string_length + local_b8) goto LAB_002034bb;
              puVar5 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_c0)
              ;
            }
            else {
LAB_002034bb:
              puVar5 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_c0,(ulong)local_78._M_dataplus._M_p);
            }
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            psVar8 = puVar5 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_e0.field_2._M_allocated_capacity = *psVar8;
              local_e0.field_2._8_8_ = puVar5[3];
            }
            else {
              local_e0.field_2._M_allocated_capacity = *psVar8;
              local_e0._M_dataplus._M_p = (pointer)*puVar5;
            }
            local_e0._M_string_length = puVar5[1];
            *puVar5 = psVar8;
            puVar5[1] = 0;
            *(undefined1 *)psVar8 = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_e0);
            plVar7 = plVar4 + 2;
            if ((long *)*plVar4 == plVar7) {
              local_f0 = *plVar7;
              lStack_e8 = plVar4[3];
              local_100 = &local_f0;
            }
            else {
              local_f0 = *plVar7;
              local_100 = (long *)*plVar4;
            }
            local_f8 = plVar4[1];
            *plVar4 = (long)plVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_100);
            if (local_100 != &local_f0) {
              operator_delete(local_100,local_f0 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if (local_c0 != &local_b0) {
              operator_delete(local_c0,local_b0 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            uVar11 = local_40[0];
            _Var12._M_p = (pointer)local_50[0];
            if (local_50[0] !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40) {
LAB_0020378f:
              operator_delete(_Var12._M_p,uVar11 + 1);
            }
          }
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        } while ((_Rb_tree_header *)p_Var6 != p_Var13);
      }
    }
  }
  else {
    if ((char)local_a0 != '\0') {
      std::__cxx11::string::append((char *)code_ptr);
    }
    if (this->needs_math_import_ != true) {
      return;
    }
  }
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void BeginFile(const std::string &name_space_name, const bool needs_imports,
                 const bool is_enum, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code = code +
           "// Code generated by the FlatBuffers compiler. DO NOT EDIT.\n\n";
    code += "package " + name_space_name + "\n\n";
    if (needs_imports) {
      code += "import (\n";
      // standard imports, in alphabetical order for go fmt
      if (needs_bytes_import_) code += "\t\"bytes\"\n";
      if (!parser_.opts.go_import.empty()) {
        code += "\tflatbuffers \"" + parser_.opts.go_import + "\"\n";
      } else {
        code += "\tflatbuffers \"github.com/google/flatbuffers/go\"\n";
      }
      // math is needed to support non-finite scalar default values.
      if (needs_math_import_) { code += "\t\"math\"\n"; }
      if (is_enum) { code += "\t\"strconv\"\n"; }

      if (tracked_imported_namespaces_.size() > 0) {
        code += "\n";
        for (auto it = tracked_imported_namespaces_.begin();
             it != tracked_imported_namespaces_.end(); ++it) {
          if ((*it)->defined_namespace->components.empty()) {
            code += "\t" + (*it)->name + " \"" + (*it)->name + "\"\n";
          } else {
            code += "\t" + NamespaceImportName((*it)->defined_namespace) +
                    " \"" + NamespaceImportPath((*it)->defined_namespace) +
                    "\"\n";
          }
        }
      }
      code += ")\n\n";
    } else {
      if (is_enum) { code += "import \"strconv\"\n\n"; }
      if (needs_math_import_) {
        // math is needed to support non-finite scalar default values.
        code += "import \"math\"\n\n";
      }
    }
  }